

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

Vec_Wec_t * Abc_NtkDetectObjClasses(Abc_Ntk_t *pNtk,Vec_Int_t *vObjs,Vec_Wec_t **pvCos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  Hsh_VecMan_t *p;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  Abc_Obj_t *pObj;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *pVVar8;
  Vec_Int_t *vVec1;
  
  p = (Hsh_VecMan_t *)calloc(1,0x48);
  iVar1 = Abc_PrimeCudd(1000);
  pVVar4 = Vec_IntStartFull(iVar1);
  p->vTable = pVVar4;
  pVVar4 = Vec_IntAlloc(4000);
  p->vData = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  p->vMap = pVVar4;
  pVVar4 = Vec_IntStartFull(pNtk->vObjs->nSize);
  pVVar5 = Vec_IntAlloc(0x10);
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x193,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  pVVar7 = pVVar5;
  iVar1 = Hsh_VecManAdd(p,pVVar5);
  if (iVar1 == 0) {
    for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
      pvVar6 = Vec_PtrEntry(pNtk->vCos,iVar1);
      Vec_IntFill(pVVar5,1,*(int *)((long)pvVar6 + 0x10));
      iVar2 = Hsh_VecManAdd(p,pVVar5);
      pVVar7 = (Vec_Int_t *)(ulong)*(uint *)((long)pvVar6 + 0x10);
      Vec_IntWriteEntry(pVVar4,*(uint *)((long)pvVar6 + 0x10),iVar2);
    }
    Vec_IntSort(vObjs,(int)pVVar7);
    for (iVar1 = 0; iVar1 < vObjs->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vObjs,iVar1);
      pObj = Abc_NtkObj(pNtk,iVar2);
      if (pObj != (Abc_Obj_t *)0x0) {
        Abc_NtkDetectObjClasses_rec(pObj,pVVar4,p,pVVar5);
      }
    }
    Vec_IntFree(pVVar5);
    pVVar5 = Vec_IntStartFull(p->vMap->nSize + 1);
    p_00 = Vec_WecAlloc(1000);
    iVar1 = 0;
    while( true ) {
      if (vObjs->nSize <= iVar1) {
        iVar1 = p_00->nSize;
        pVVar8 = Vec_WecStart(iVar1);
        *pvCos = pVVar8;
        iVar2 = 0;
        if (iVar1 < 1) {
          iVar1 = 0;
          iVar2 = 0;
        }
        while( true ) {
          if (iVar1 == iVar2) {
            Vec_IntFree(p->vTable);
            Vec_IntFree(p->vData);
            Vec_IntFree(p->vMap);
            free(p);
            Vec_IntFree(pVVar5);
            Vec_IntFree(pVVar4);
            return p_00;
          }
          pVVar7 = Vec_WecEntry(p_00,iVar2);
          iVar3 = Vec_IntEntry(pVVar7,0);
          iVar3 = Vec_IntEntry(pVVar4,iVar3);
          if (iVar3 < 0) break;
          pVVar7 = Hsh_VecReadEntry(p,iVar3);
          vVec1 = Vec_WecEntry(*pvCos,iVar2);
          Vec_IntAppend(vVec1,pVVar7);
          iVar2 = iVar2 + 1;
        }
        __assert_fail("SetId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                      ,0x1c4,
                      "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
      }
      iVar2 = Vec_IntEntry(vObjs,iVar1);
      iVar3 = Vec_IntEntry(pVVar4,iVar2);
      if (iVar3 < 0) break;
      i = Vec_IntEntry(pVVar5,iVar3);
      if (i == -1) {
        Vec_IntWriteEntry(pVVar5,iVar3,p_00->nSize);
        pVVar7 = Vec_WecPushLevel(p_00);
      }
      else {
        pVVar7 = Vec_WecEntry(p_00,i);
      }
      Vec_IntPush(pVVar7,iVar2);
      iVar1 = iVar1 + 1;
    }
    __assert_fail("SetId >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x1ac,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  __assert_fail("SetId == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                ,0x196,"Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)")
  ;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectObjClasses( Abc_Ntk_t * pNtk, Vec_Int_t * vObjs, Vec_Wec_t ** pvCos )
{
    Vec_Wec_t * vClasses;   // classes of equivalence objects from vObjs
    Vec_Int_t * vClassMap;  // mapping of each CO set into its class in vClasses
    Vec_Int_t * vClass;     // one equivalence class     
    Abc_Obj_t * pObj; 
    int i, iObj, SetId, ClassId;
    // create hash table to hash sets of CO indexes
    Hsh_VecMan_t * pHash = Hsh_VecManStart( 1000 );
    // create elementary sets (each composed of one CO) and map COs into them
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Vec_Int_t * vSet = Vec_IntAlloc( 16 );
    assert( Abc_NtkIsLogic(pNtk) );
    // compute empty set
    SetId = Hsh_VecManAdd( pHash, vSet );
    assert( SetId == 0 );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Vec_IntFill( vSet, 1, Abc_ObjId(pObj) );
        SetId = Hsh_VecManAdd( pHash, vSet );
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), SetId );
    }
    // make sure the array of objects is sorted
    Vec_IntSort( vObjs, 0 );
    // begin from the objects and map their IDs into sets of COs
    Abc_NtkForEachObjVec( vObjs, pNtk, pObj, i )
        Abc_NtkDetectObjClasses_rec( pObj, vMap, pHash, vSet );
    Vec_IntFree( vSet );
    // create map for mapping CO set its their classes
    vClassMap = Vec_IntStartFull( Hsh_VecSize(pHash) + 1 );
    // collect classes of objects
    vClasses = Vec_WecAlloc( 1000 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        //char * pName = Abc_ObjName( Abc_NtkObj(pNtk, iObj) );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set, finds its equivalence class
        ClassId = Vec_IntEntry( vClassMap, SetId );
        if ( ClassId == -1 )  // there is no equivalence class
        {
            // map this CO set into a new equivalence class
            Vec_IntWriteEntry( vClassMap, SetId, Vec_WecSize(vClasses) );
            vClass = Vec_WecPushLevel( vClasses );
        }
        else // get hold of the equivalence class
            vClass = Vec_WecEntry( vClasses, ClassId );
        // add objects to the class
        Vec_IntPush( vClass, iObj );
        // print the set for this object
        //printf( "Object %5d : ", iObj );
        //Vec_IntPrint( Hsh_VecReadEntry(pHash, SetId) );
    }
    // collect arrays of COs for each class
    *pvCos = Vec_WecStart( Vec_WecSize(vClasses) );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        iObj = Vec_IntEntry( vClass, 0 );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set ID, find the set
        vSet = Hsh_VecReadEntry( pHash, SetId );
        Vec_IntAppend( Vec_WecEntry(*pvCos, i), vSet );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vClassMap );
    Vec_IntFree( vMap );
    return vClasses;
}